

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_convert(uchar *out,uchar *in,LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,
                    uint w,uint h)

{
  uchar *puVar1;
  bool bVar2;
  uchar uVar3;
  unsigned_short grey;
  int iVar4;
  uchar uVar7;
  uint uVar5;
  size_t sVar6;
  uchar uVar11;
  size_t sVar9;
  LodePNGColorMode *pLVar10;
  uint has_alpha;
  uchar uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ColorTree *unaff_R13;
  long lVar16;
  byte bVar17;
  unsigned_short a;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  ColorTree tree;
  unsigned_short local_e8;
  unsigned_short local_e6;
  unsigned_short local_e4;
  unsigned_short local_e2;
  uchar *local_e0;
  byte local_d1;
  LodePNGColorMode *local_d0;
  ulong local_c8;
  LodePNGColorMode *local_c0;
  ColorTree local_b8;
  uchar uVar8;
  
  local_e0 = out;
  iVar4 = lodepng_color_mode_equal(mode_out,mode_in);
  if (iVar4 == 0) {
    local_c8 = (ulong)(h * w);
    local_d0 = mode_out;
    if (mode_out->colortype == LCT_PALETTE) {
      uVar13 = 1L << ((byte)mode_out->bitdepth & 0x3f);
      uVar15 = mode_out->palettesize;
      pLVar10 = mode_out;
      if (uVar15 == 0) {
        uVar15 = mode_in->palettesize;
        pLVar10 = mode_in;
      }
      if (uVar15 < uVar13) {
        uVar13 = uVar15;
      }
      puVar1 = pLVar10->palette;
      local_b8.children[0xe] = (ColorTree *)0x0;
      local_b8.children[0xf] = (ColorTree *)0x0;
      local_b8.children[0xc] = (ColorTree *)0x0;
      local_b8.children[0xd] = (ColorTree *)0x0;
      local_b8.children[10] = (ColorTree *)0x0;
      local_b8.children[0xb] = (ColorTree *)0x0;
      local_b8.children[8] = (ColorTree *)0x0;
      local_b8.children[9] = (ColorTree *)0x0;
      local_b8.children[6] = (ColorTree *)0x0;
      local_b8.children[7] = (ColorTree *)0x0;
      local_b8.children[4] = (ColorTree *)0x0;
      local_b8.children[5] = (ColorTree *)0x0;
      local_b8.children[2] = (ColorTree *)0x0;
      local_b8.children[3] = (ColorTree *)0x0;
      local_b8.children[0] = (ColorTree *)0x0;
      local_b8.children[1] = (ColorTree *)0x0;
      local_b8.index = -1;
      if (uVar15 != 0) {
        uVar15 = 0;
        unaff_R13 = &local_b8;
        do {
          color_tree_add(unaff_R13,puVar1[uVar15 * 4],puVar1[uVar15 * 4 + 1],puVar1[uVar15 * 4 + 2],
                         puVar1[uVar15 * 4 + 3],(uint)uVar15);
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
      }
    }
    pLVar10 = local_d0;
    uVar5 = (uint)unaff_R13;
    if ((mode_in->bitdepth == 0x10) && (local_d0->bitdepth == 0x10)) {
      if (local_c8 != 0) {
        lVar14 = 0;
        sVar6 = 0;
        do {
          local_e2 = 0;
          local_e4 = 0;
          local_e6 = 0;
          local_e8 = 0;
          getPixelColorRGBA16(&local_e2,&local_e4,&local_e6,&local_e8,in,sVar6,mode_in);
          uVar3 = (uchar)local_e2;
          uVar7 = (uchar)(local_e2 >> 8);
          uVar11 = (uchar)(local_e8 >> 8);
          uVar12 = (uchar)(local_e4 >> 8);
          uVar8 = (uchar)(local_e6 >> 8);
          switch(local_d0->colortype) {
          case LCT_GREY:
            *(unsigned_short *)(local_e0 + sVar6 * 2) = local_e2 << 8 | local_e2 >> 8;
            break;
          case LCT_RGB:
            local_e0[lVar14] = uVar7;
            local_e0[lVar14 + 1] = uVar3;
            local_e0[lVar14 + 2] = uVar12;
            local_e0[lVar14 + 3] = (uchar)local_e4;
            local_e0[lVar14 + 4] = uVar8;
            local_e0[lVar14 + 5] = (uchar)local_e6;
            break;
          case LCT_GREY_ALPHA:
            local_e0[sVar6 * 4] = uVar7;
            local_e0[sVar6 * 4 + 1] = uVar3;
            local_e0[sVar6 * 4 + 2] = uVar11;
            local_e0[sVar6 * 4 + 3] = (uchar)local_e8;
            break;
          case LCT_RGBA:
            local_e0[sVar6 * 8] = uVar7;
            local_e0[sVar6 * 8 + 1] = uVar3;
            local_e0[sVar6 * 8 + 2] = uVar12;
            local_e0[sVar6 * 8 + 3] = (uchar)local_e4;
            local_e0[sVar6 * 8 + 4] = uVar8;
            local_e0[sVar6 * 8 + 5] = (uchar)local_e6;
            local_e0[sVar6 * 8 + 6] = uVar11;
            local_e0[sVar6 * 8 + 7] = (uchar)local_e8;
          }
          sVar6 = sVar6 + 1;
          lVar14 = lVar14 + 6;
        } while (local_c8 != sVar6);
      }
    }
    else if ((local_d0->bitdepth == 8) &&
            ((has_alpha = 1, local_d0->colortype == LCT_RGBA ||
             (has_alpha = 0, local_d0->colortype == LCT_RGB)))) {
      getPixelColorsRGBA8(local_e0,local_c8,has_alpha,in,mode_in);
    }
    else {
      local_e2 = local_e2 & 0xff00;
      local_e4 = local_e4 & 0xff00;
      local_e6 = local_e6 & 0xff00;
      local_e8 = local_e8 & 0xff00;
      bVar17 = local_c8 == 0;
      if (!(bool)bVar17) {
        lVar14 = 1;
        lVar16 = 0;
        sVar6 = 0;
        local_c0 = mode_in;
        do {
          local_d1 = bVar17;
          getPixelColorRGBA8((uchar *)&local_e2,(uchar *)&local_e4,(uchar *)&local_e6,
                             (uchar *)&local_e8,in,sVar6,local_c0);
          switch(pLVar10->colortype) {
          case LCT_GREY:
            uVar5 = pLVar10->bitdepth;
            if (uVar5 == 0x10) {
              local_e0[lVar14] = (byte)local_e2;
              local_e0[lVar14 + -1] = (byte)local_e2;
            }
            else if (uVar5 == 8) {
              local_e0[sVar6] = (byte)local_e2;
            }
            else {
              addColorBits(local_e0,sVar6,uVar5,
                           ~(-1 << ((byte)uVar5 & 0x1f)) &
                           (uint)((byte)local_e2 >> (8 - (byte)uVar5 & 0x1f)));
            }
            break;
          case LCT_RGB:
            if (pLVar10->bitdepth == 8) {
              local_e0[lVar16] = (byte)local_e2;
              local_e0[lVar16 + 1] = (uchar)local_e4;
              local_e0[lVar16 + 2] = (uchar)local_e6;
            }
            else {
              local_e0[lVar16 * 2 + 1] = (byte)local_e2;
              local_e0[lVar16 * 2] = (byte)local_e2;
              local_e0[lVar16 * 2 + 3] = (uchar)local_e4;
              local_e0[lVar16 * 2 + 2] = (uchar)local_e4;
              local_e0[lVar16 * 2 + 5] = (uchar)local_e6;
              local_e0[lVar16 * 2 + 4] = (uchar)local_e6;
            }
            break;
          case LCT_PALETTE:
            uVar5 = color_tree_get(&local_b8,(byte)local_e2,(uchar)local_e4,(uchar)local_e6,
                                   (uchar)local_e8);
            if ((int)uVar5 < 0) {
              uVar5 = 0x52;
              bVar2 = false;
            }
            else {
              if (pLVar10->bitdepth == 8) {
                local_e0[sVar6] = (uchar)uVar5;
              }
              else {
                addColorBits(local_e0,sVar6,pLVar10->bitdepth,uVar5);
              }
              uVar5 = 0;
              bVar2 = true;
            }
            goto LAB_00122e36;
          case LCT_GREY_ALPHA:
            if (pLVar10->bitdepth == 0x10) {
              local_e0[lVar14 * 2 + -1] = (byte)local_e2;
              local_e0[lVar14 * 2 + -2] = (byte)local_e2;
              local_e0[lVar14 * 2 + 1] = (uchar)local_e8;
              local_e0[lVar14 * 2] = (uchar)local_e8;
            }
            else if (pLVar10->bitdepth == 8) {
              local_e0[lVar14 + -1] = (byte)local_e2;
              local_e0[lVar14] = (uchar)local_e8;
            }
            break;
          case LCT_RGBA:
            if (pLVar10->bitdepth == 8) {
              local_e0[lVar14 * 2 + -2] = (byte)local_e2;
              local_e0[lVar14 * 2 + -1] = (uchar)local_e4;
              local_e0[lVar14 * 2] = (uchar)local_e6;
              local_e0[lVar14 * 2 + 1] = (uchar)local_e8;
            }
            else {
              local_e0[lVar14 * 4 + -3] = (byte)local_e2;
              local_e0[lVar14 * 4 + -4] = (byte)local_e2;
              local_e0[lVar14 * 4 + -1] = (uchar)local_e4;
              local_e0[lVar14 * 4 + -2] = (uchar)local_e4;
              local_e0[lVar14 * 4 + 1] = (uchar)local_e6;
              local_e0[lVar14 * 4] = (uchar)local_e6;
              local_e0[lVar14 * 4 + 3] = (uchar)local_e8;
              local_e0[lVar14 * 4 + 2] = (uchar)local_e8;
            }
          }
          bVar2 = true;
          uVar5 = 0;
LAB_00122e36:
          unaff_R13 = (ColorTree *)((ulong)unaff_R13 & 0xffffffff);
          if (!bVar2) {
            unaff_R13 = (ColorTree *)(ulong)uVar5;
          }
          uVar5 = (uint)unaff_R13;
          bVar17 = local_d1;
          if (!bVar2) break;
          sVar6 = sVar6 + 1;
          lVar14 = lVar14 + 2;
          lVar16 = lVar16 + 3;
          bVar17 = local_c8 == sVar6;
        } while (!(bool)bVar17);
      }
      if ((bVar17 & 1) == 0) {
        return uVar5;
      }
    }
    if (local_d0->colortype == LCT_PALETTE) {
      color_tree_cleanup(&local_b8);
    }
  }
  else {
    sVar6 = lodepng_get_raw_size(w,h,mode_in);
    if (sVar6 != 0) {
      sVar9 = 0;
      do {
        local_e0[sVar9] = in[sVar9];
        sVar9 = sVar9 + 1;
      } while (sVar6 != sVar9);
    }
  }
  return 0;
}

Assistant:

unsigned lodepng_convert(unsigned char* out, const unsigned char* in,
                         const LodePNGColorMode* mode_out, const LodePNGColorMode* mode_in,
                         unsigned w, unsigned h)
{
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;

  if(lodepng_color_mode_equal(mode_out, mode_in))
  {
    size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
    for(i = 0; i != numbytes; ++i) out[i] = in[i];
    return 0;
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    size_t palettesize = mode_out->palettesize;
    const unsigned char* palette = mode_out->palette;
    size_t palsize = 1u << mode_out->bitdepth;
    /*if the user specified output palette but did not give the values, assume
    they want the values of the input color type (assuming that one is palette).
    Note that we never create a new palette ourselves.*/
    if(palettesize == 0)
    {
      palettesize = mode_in->palettesize;
      palette = mode_in->palette;
    }
    if(palettesize < palsize) palsize = palettesize;
    color_tree_init(&tree);
    for(i = 0; i != palsize; ++i)
    {
      const unsigned char* p = &palette[i * 4];
      color_tree_add(&tree, p[0], p[1], p[2], p[3], i);
    }
  }

  if(mode_in->bitdepth == 16 && mode_out->bitdepth == 16)
  {
    for(i = 0; i != numpixels; ++i)
    {
      unsigned short r = 0, g = 0, b = 0, a = 0;
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      rgba16ToPixel(out, i, mode_out, r, g, b, a);
    }
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGBA)
  {
    getPixelColorsRGBA8(out, numpixels, 1, in, mode_in);
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGB)
  {
    getPixelColorsRGBA8(out, numpixels, 0, in, mode_in);
  }
  else
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
      CERROR_TRY_RETURN(rgba8ToPixel(out, i, mode_out, &tree, r, g, b, a));
    }
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    color_tree_cleanup(&tree);
  }

  return 0; /*no error*/
}